

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QLabel::setTextInteractionFlags(QLabel *this,TextInteractionFlags flags)

{
  QLabelPrivate *this_00;
  FocusPolicy FVar1;
  
  this_00 = *(QLabelPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  if ((QFlagsStorageHelper<Qt::TextInteractionFlag,_4>)
      (this_00->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
      super_QFlagsStorage<Qt::TextInteractionFlag>.i ==
      (QFlagsStorage<Qt::TextInteractionFlag>)
      flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
      super_QFlagsStorage<Qt::TextInteractionFlag>.i) {
    return;
  }
  (this_00->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
  super_QFlagsStorage<Qt::TextInteractionFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
            super_QFlagsStorage<Qt::TextInteractionFlag>.i;
  FVar1 = StrongFocus;
  if (((uint)flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i & 8) == 0) {
    FVar1 = (uint)(((uint)flags.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                          super_QFlagsStorage<Qt::TextInteractionFlag>.i & 3) != 0) * 2;
  }
  QWidget::setFocusPolicy((QWidget *)this,FVar1);
  if (((this_00->field_0x340 & 0x10) == 0) ||
     (((this_00->effectiveTextFormat == PlainText &&
       (((this_00->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
         super_QFlagsStorage<Qt::TextInteractionFlag>.i & 3) == 0)) &&
      (FVar1 = QWidget::focusPolicy
                         (*(QWidget **)
                           &(this_00->super_QFramePrivate).super_QWidgetPrivate.field_0x8),
      FVar1 == NoFocus)))) {
    if (this_00->control != (QWidgetTextControl *)0x0) {
      (**(code **)(*(long *)this_00->control + 0x20))();
    }
    this_00->control = (QWidgetTextControl *)0x0;
  }
  else {
    QLabelPrivate::ensureTextControl(this_00);
  }
  if ((QWidgetTextControl *)this_00->control == (QWidgetTextControl *)0x0) {
    return;
  }
  QWidgetTextControl::setTextInteractionFlags
            ((QWidgetTextControl *)this_00->control,
             (TextInteractionFlags)
             (this_00->textInteractionFlags).super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
             super_QFlagsStorage<Qt::TextInteractionFlag>.i);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }